

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void luaV_finishget(lua_State *L,TValue *t,TValue *key,StkId val,TValue *slot)

{
  Table *events;
  TValue *f;
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  
  iVar2 = 2000;
  do {
    if (slot == (TValue *)0x0) {
      if ((t->tt_ & 0xf) == 5) {
        __assert_fail("!(((((((t))->tt_)) & 0x0F)) == (5))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xd9,
                      "void luaV_finishget(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                     );
      }
      f = luaT_gettmbyobj(L,t,TM_INDEX);
      if (f->tt_ == 0) {
        luaG_typeerror(L,t,"index");
      }
    }
    else {
      if (slot->tt_ != 0) {
        __assert_fail("((((slot))->tt_) == (0))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xe0,
                      "void luaV_finishget(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                     );
      }
      if (t->tt_ != 0x8005) {
        pcVar3 = "((((t))->tt_) == (((5) | (1 << 15))))";
LAB_00124eca:
        __assert_fail(pcVar3,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xe1,
                      "void luaV_finishget(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                     );
      }
      if ((t->value_).f[8] != (_func_int_lua_State_ptr)0x5) {
        pcVar3 = "(((t)->value_).gc)->tt == 5";
        goto LAB_00124eca;
      }
      events = *(Table **)((t->value_).f + 0x28);
      if ((events == (Table *)0x0) || ((events->flags & 1) != 0)) {
        f = (TValue *)0x0;
      }
      else {
        f = luaT_gettm(events,TM_INDEX,L->l_G->tmname[0]);
      }
      if (f == (TValue *)0x0) {
        val->tt_ = 0;
        return;
      }
    }
    uVar1 = f->tt_ & 0xf;
    if (uVar1 == 5) {
      if (f->tt_ != 0x8005) {
        pcVar3 = "((((t))->tt_) == (((5) | (1 << 15))))";
LAB_00124ef2:
        __assert_fail(pcVar3,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0xed,
                      "void luaV_finishget(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                     );
      }
      if (((Table *)(f->value_).gc)->tt != '\x05') {
        pcVar3 = "(((t)->value_).gc)->tt == 5";
        goto LAB_00124ef2;
      }
      slot = luaH_get((Table *)(f->value_).gc,key);
      if (slot->tt_ != 0) {
        val->value_ = slot->value_;
        uVar1 = slot->tt_;
        val->tt_ = uVar1;
        if (((short)uVar1 < 0) &&
           (((uVar1 & 0x7f) != (ushort)((val->value_).gc)->tt ||
            ((L != (lua_State *)0x0 &&
             ((((val->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))))) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0xee,
                        "void luaV_finishget(lua_State *, const TValue *, TValue *, StkId, const TValue *)"
                       );
        }
        return;
      }
    }
    else {
      if (uVar1 == 6) {
        luaT_callTM(L,f,t,key,val,1);
        return;
      }
      slot = (TValue *)0x0;
    }
    iVar2 = iVar2 + -1;
    t = f;
    if (iVar2 == 0) {
      luaG_runerror(L,"\'__index\' chain too long; possible loop");
    }
  } while( true );
}

Assistant:

void luaV_finishget (lua_State *L, const TValue *t, TValue *key, StkId val,
                      const TValue *slot) {
  int loop;  /* counter to avoid infinite loops */
  const TValue *tm;  /* metamethod */
  for (loop = 0; loop < MAXTAGLOOP; loop++) {
    if (slot == NULL) {  /* 't' is not a table? */
      lua_assert(!ttistable(t));
      tm = luaT_gettmbyobj(L, t, TM_INDEX);
      if (ttisnil(tm))
        luaG_typeerror(L, t, "index");  /* no metamethod */
      /* else will try the metamethod */
    }
    else {  /* 't' is a table */
      lua_assert(ttisnil(slot));
      tm = fasttm(L, hvalue(t)->metatable, TM_INDEX);  /* table's metamethod */
      if (tm == NULL) {  /* no metamethod? */
        setnilvalue(val);  /* result is nil */
        return;
      }
      /* else will try the metamethod */
    }
    if (ttisfunction(tm)) {  /* is metamethod a function? */
      luaT_callTM(L, tm, t, key, val, 1);  /* call it */
      return;
    }
    t = tm;  /* else try to access 'tm[key]' */
    if (luaV_fastget(L,t,key,slot,luaH_get)) {  /* fast track? */
      setobj2s(L, val, slot);  /* done */
      return;
    }
    /* else repeat (tail call 'luaV_finishget') */
  }
  luaG_runerror(L, "'__index' chain too long; possible loop");
}